

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

float32 helper_recps_f32_aarch64(float32 a,float32 b,CPUARMState_conflict *env)

{
  int iVar1;
  float32 b_00;
  float_status *s_00;
  float_status *s;
  CPUARMState_conflict *env_local;
  float32 b_local;
  float32 a_local;
  
  s_00 = &(env->vfp).standard_fp_status;
  iVar1 = float32_is_infinity(a);
  if (iVar1 == 0) {
LAB_00804150:
    iVar1 = float32_is_infinity(b);
    if (iVar1 != 0) {
      iVar1 = float32_is_zero_or_denormal(a);
      if (iVar1 != 0) goto LAB_0080416a;
    }
    b_00 = float32_mul_aarch64(a,b,s_00);
    b_local = float32_sub_aarch64(0x40000000,b_00,s_00);
  }
  else {
    iVar1 = float32_is_zero_or_denormal(b);
    if (iVar1 == 0) goto LAB_00804150;
LAB_0080416a:
    iVar1 = float32_is_zero(a);
    if (iVar1 == 0) {
      iVar1 = float32_is_zero(b);
      if (iVar1 == 0) {
        float_raise_aarch64('@',s_00);
      }
    }
    b_local = 0x40000000;
  }
  return b_local;
}

Assistant:

float32 HELPER(recps_f32)(float32 a, float32 b, CPUARMState *env)
{
    float_status *s = &env->vfp.standard_fp_status;
    if ((float32_is_infinity(a) && float32_is_zero_or_denormal(b)) ||
        (float32_is_infinity(b) && float32_is_zero_or_denormal(a))) {
        if (!(float32_is_zero(a) || float32_is_zero(b))) {
            float_raise(float_flag_input_denormal, s);
        }
        return float32_two;
    }
    return float32_sub(float32_two, float32_mul(a, b, s), s);
}